

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz-test.cpp
# Opt level: O2

void __thiscall test_butter::test_method(test_butter *this)

{
  long lVar1;
  undefined8 local_2b0;
  undefined8 local_2a8;
  double actual_gain;
  double expected_gain;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  tuple<double,_std::array<double,_7UL>,_std::array<double,_7UL>_> local_230;
  array<double,_7UL> actual_a;
  array<double,_7UL> actual_b;
  array<double,_7UL> expected_a;
  array<double,_7UL> expected_b;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  expected_gain = 2.18780328998614e-06;
  expected_b._M_elems[4] = 15.0;
  expected_b._M_elems[5] = 6.0;
  expected_b._M_elems[2] = 15.0;
  expected_b._M_elems[3] = 20.0;
  expected_b._M_elems[0] = 1.0;
  expected_b._M_elems[1] = 6.0;
  expected_b._M_elems[6] = 1.0;
  expected_a._M_elems[4] = 7.801326239249508;
  expected_a._M_elems[5] = -2.683448745937741;
  expected_a._M_elems[2] = 10.699633740567215;
  expected_a._M_elems[3] = -12.151435255115082;
  expected_a._M_elems[0] = 1.0;
  expected_a._M_elems[1] = -5.052163948341672;
  expected_a._M_elems[6] = 0.38622798898833;
  butter_lp<6>(&local_230,2048000.0,80000.0);
  actual_gain = local_230.
                super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
                super__Head_base<0UL,_double,_false>._M_head_impl;
  actual_b._M_elems[0] =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0];
  actual_b._M_elems[1] =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1];
  actual_b._M_elems[2] =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2];
  actual_b._M_elems[3] =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3];
  actual_b._M_elems[4] =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[4];
  actual_b._M_elems[5] =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[5];
  actual_b._M_elems[6] =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Head_base<1UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[6];
  actual_a._M_elems[0]._0_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0]._0_4_;
  actual_a._M_elems[0]._4_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0]._4_4_;
  actual_a._M_elems[1]._0_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_;
  actual_a._M_elems[1]._4_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._4_4_;
  actual_a._M_elems[2]._0_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2]._0_4_;
  actual_a._M_elems[2]._4_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2]._4_4_;
  actual_a._M_elems[3]._0_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3]._0_4_;
  actual_a._M_elems[3]._4_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3]._4_4_;
  actual_a._M_elems[4]._0_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[4]._0_4_;
  actual_a._M_elems[4]._4_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[4]._4_4_;
  actual_a._M_elems[5]._0_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[5]._0_4_;
  actual_a._M_elems[5]._4_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[5]._4_4_;
  actual_a._M_elems[6] =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[6];
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x27);
  local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ &
       0xffffff00;
  local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0] =
       (double)&PTR__lazy_ostream_00116a40;
  local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2] =
       (double)&boost::unit_test::lazy_ostream::inst;
  local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3] =
       5.5360846121545e-318;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_58 = "";
  local_2b0 = 0x3d719799812dea11;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
            (&local_230,&local_60,0x27,1,8,&expected_gain,"expected_gain",&actual_gain,"actual_gain"
             ,&local_2b0,"::boost::math::fpc::percent_tolerance(1e-12)");
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x28);
  local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ &
       0xffffff00;
  local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0] =
       (double)&PTR__lazy_ostream_00116a40;
  local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2] =
       (double)&boost::unit_test::lazy_ostream::inst;
  local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3] =
       5.5360846121545e-318;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_88 = "";
  local_2b0 = 7;
  local_2a8 = 7;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_230,&local_90,0x28,2,2,&local_2b0,"distance(a, ae)",&local_2a8,
             "distance(b, end(actual_b))");
  for (lVar1 = 0; lVar1 != 0x38; lVar1 = lVar1 + 8) {
    local_240 = 
    "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
    local_238 = "";
    local_250 = &boost::unit_test::basic_cstring<char_const>::null;
    local_248 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x28,&local_250);
    local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ =
         local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>
         .super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
         super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
         super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ &
         0xffffff00;
    local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0] =
         (double)&PTR__lazy_ostream_00116a40;
    local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2] =
         (double)&boost::unit_test::lazy_ostream::inst;
    local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3] =
         5.5360846121545e-318;
    local_260 = 
    "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
    local_258 = "";
    local_2b0 = 0x3d719799812dea11;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (&local_230,&local_260,0x28,1,8,(long)expected_b._M_elems + lVar1,"*a",
               (long)actual_b._M_elems + lVar1,"*b",&local_2b0,
               "::boost::math::fpc::percent_tolerance(1e-12)");
  }
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x29);
  local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ =
       local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
       super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
       super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ &
       0xffffff00;
  local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0] =
       (double)&PTR__lazy_ostream_00116a40;
  local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2] =
       (double)&boost::unit_test::lazy_ostream::inst;
  local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
  super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
  super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3] =
       5.5360846121545e-318;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_b8 = "";
  local_2b0 = 7;
  local_2a8 = 7;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_230,&local_c0,0x29,2,2,&local_2b0,"distance(a, ae)",&local_2a8,
             "distance(b, end(actual_a))");
  for (lVar1 = 0; lVar1 != 0x38; lVar1 = lVar1 + 8) {
    local_270 = 
    "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
    local_268 = "";
    local_280 = &boost::unit_test::basic_cstring<char_const>::null;
    local_278 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_270,0x29,&local_280);
    local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ =
         local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>
         .super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
         super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
         super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[1]._0_4_ &
         0xffffff00;
    local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[0] =
         (double)&PTR__lazy_ostream_00116a40;
    local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[2] =
         (double)&boost::unit_test::lazy_ostream::inst;
    local_230.super__Tuple_impl<0UL,_double,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<1UL,_std::array<double,_7UL>,_std::array<double,_7UL>_>.
    super__Tuple_impl<2UL,_std::array<double,_7UL>_>.
    super__Head_base<2UL,_std::array<double,_7UL>,_false>._M_head_impl._M_elems[3] =
         5.5360846121545e-318;
    local_290 = 
    "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
    local_288 = "";
    local_2b0 = 0x3d719799812dea11;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (&local_230,&local_290,0x29,1,8,(long)expected_a._M_elems + lVar1,"*a",
               (long)actual_a._M_elems + lVar1,"*b",&local_2b0,
               "::boost::math::fpc::percent_tolerance(1e-12)");
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_butter)
{
    // generated with octave signal package
    // > pkg load signal
    // > [b,a] = butter(6, 2*80000/2048000)
    double expected_gain = 2.18780328998614e-06;
    std::array<double, 7> expected_b({ 1, 6, 15, 20, 15, 6, 1 });
    std::array<double, 7> expected_a(
      { 1, -5.052163948341672, 10.699633740567215, -12.151435255115082,
        7.801326239249508, -2.683448745937741, 0.386227988988330 });

    double actual_gain;
    std::array<double, 7 > actual_b;
    std::array<double, 7 > actual_a;

    std::tie(actual_gain, actual_b, actual_a) = butter_lp<6>(2048000, 80000);

    BOOST_CHECK_CLOSE(expected_gain, actual_gain, 1e-12);
    CHECK_CLOSE_COLLECTION(expected_b, actual_b, 1e-12);
    CHECK_CLOSE_COLLECTION(expected_a, actual_a, 1e-12);
}